

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O1

bool testing::TestResult::ValidateTestProperty(string *xml_element,TestProperty *test_property)

{
  ostream *poVar1;
  AssertHelper AVar2;
  pointer pbVar3;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  ulong uVar5;
  int *piVar6;
  long lVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  ulong uVar9;
  AssertHelper local_c0;
  allocator local_b1;
  Message local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  ostream *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  char *local_70;
  long local_68;
  char local_60 [16];
  string local_50;
  
  std::__cxx11::string::string((string *)&local_70,(test_property->key_)._M_dataplus._M_p,&local_b1)
  ;
  GetReservedAttributesForElement(&local_a8,xml_element);
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    (local_a8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_a8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_70);
  pbVar3 = local_a8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar8 = local_a8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (_Var4._M_current !=
      local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    Message::Message(&local_b0);
    local_90 = local_b0.ss_.ptr_;
    poVar1 = (ostream *)((long)local_b0.ss_.ptr_ + 0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"Reserved key used in RecordProperty(): ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_70,local_68);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," (",2);
    local_78 = pbVar3;
    local_88 = _Var4._M_current;
    local_80 = poVar1;
    Message::Message((Message *)&local_c0);
    if ((long)local_a8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_a8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0) {
      uVar5 = (long)local_a8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_a8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
      piVar6 = &(local_c0.data_)->line;
      lVar7 = 8;
      uVar9 = 0;
      do {
        if (2 < uVar5 && uVar9 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)piVar6,", ",2);
        }
        if (uVar9 == ((long)local_a8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_a8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)piVar6,"and ",4);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)piVar6,"\'",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)piVar6,
                   *(char **)((long)local_a8.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar7 + -8),
                   *(long *)((long)&((local_a8.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                            + lVar7));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)piVar6,"\'",1);
        uVar9 = uVar9 + 1;
        uVar5 = (long)local_a8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_a8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5;
        lVar7 = lVar7 + 0x20;
      } while (uVar9 < uVar5);
    }
    AVar2.data_ = local_c0.data_;
    internal::StringStreamToString(&local_50,(stringstream *)local_c0.data_);
    poVar1 = local_80;
    if (AVar2.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)AVar2.data_ + 8))(AVar2.data_);
      local_c0.data_ = (AssertHelperData *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,local_50._M_dataplus._M_p,local_50._M_string_length);
    pbVar8 = local_78;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," are reserved by ",0x11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Google Test",0xb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
    internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rangolucas[P]algo2_taller1/tests/gtest-1.8.1/gtest-all.cc"
               ,0xe3a,"Failed");
    _Var4._M_current = local_88;
    internal::AssertHelper::operator=(&local_c0,&local_b0);
    internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (local_90.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_90.ptr_ + 8))();
      local_b0.ss_.ptr_ =
           (scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8);
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  return _Var4._M_current == pbVar8;
}

Assistant:

bool TestResult::ValidateTestProperty(const std::string& xml_element,
                                      const TestProperty& test_property) {
  return ValidateTestPropertyName(test_property.key(),
                                  GetReservedAttributesForElement(xml_element));
}